

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O2

_Bool square_trap_flag(chunk *c,loc grid,wchar_t flag)

{
  _Bool _Var1;
  _Bool _Var2;
  trap *ptVar3;
  
  ptVar3 = square_trap((chunk_conflict *)c,grid);
  _Var1 = square_istrap((chunk_conflict *)c,grid);
  if (_Var1) {
    while ((_Var1 = ptVar3 != (trap *)0x0, _Var1 &&
           (_Var2 = flag_has_dbg(ptVar3->flags,3,flag,"trap->flags","flag"), !_Var2))) {
      ptVar3 = ptVar3->next;
    }
  }
  else {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool square_trap_flag(struct chunk *c, struct loc grid, int flag)
{
    struct trap *trap = square_trap(c, grid);

    /* First, check the trap marker */
    if (!square_istrap(c, grid))
		return false;
	
    /* Scan the square trap list */
    while (trap) {
		/* We found a trap with the right flag */
		if (trf_has(trap->flags, flag))
			return true;
		trap = trap->next;
    }

    /* Report failure */
    return false;
}